

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::init
          (Texture3DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  *this_00;
  uint height;
  uint depth;
  pointer pPVar1;
  ulong uVar2;
  uint uVar3;
  int extraout_EAX;
  Texture3D *pTVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  Vector<float,_4> local_128;
  uint local_114;
  RGBA local_110;
  RGBA local_10c;
  Vec4 gMax;
  long local_f8;
  Vec4 gMin;
  Vec4 cBias;
  Vec4 cScale;
  Vector<float,_4> local_a8;
  TextureFormat texFmt;
  Vector<float,_4> local_90;
  tcu local_80 [16];
  TextureFormatInfo fmtInfo;
  
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  uVar9 = this->m_width;
  height = this->m_height;
  uVar3 = height;
  if ((int)height < (int)uVar9) {
    uVar3 = uVar9;
  }
  depth = this->m_depth;
  if ((int)uVar3 <= (int)depth) {
    uVar3 = depth;
  }
  uVar7 = 0x20;
  if (uVar3 != 0) {
    uVar7 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar9,
             height,depth);
  this->m_gradientTex = pTVar4;
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_depth);
  local_114 = 0x20 - uVar7;
  this->m_gridTex = pTVar4;
  uVar5 = (ulong)local_114;
  lVar8 = 0;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_128.m_data[0] = 0.0;
    local_128.m_data[1] = 0.0;
    local_128.m_data[2] = 0.0;
    local_128.m_data[3] = 1.0;
    tcu::operator*((tcu *)&gMax,&local_128,&cScale);
    tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
    local_a8.m_data[0] = 1.0;
    local_a8.m_data[1] = 1.0;
    local_a8.m_data[2] = 1.0;
    local_a8.m_data[3] = 0.0;
    tcu::operator*((tcu *)&local_128,&local_a8,&cScale);
    tcu::operator+((tcu *)&gMax,&local_128,&cBias);
    tcu::Texture3D::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar6);
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)
               ((long)(((this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_size.m_data + lVar8 + -8),&gMin,&gMax);
    lVar8 = lVar8 + 0x28;
  }
  local_f8 = 0;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = (ulong)local_114;
    tcu::Texture3D::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar6);
    uVar9 = (int)(0xffffff / uVar2) * (int)uVar6;
    local_10c.m_value = uVar9 | 0xff000000;
    pPVar1 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    tcu::RGBA::toVec(&local_10c);
    tcu::operator*((tcu *)&gMax,&local_128,&cScale);
    tcu::operator+((tcu *)&gMin,&gMax,&cBias);
    local_110.m_value = ~uVar9 | 0xff000000;
    tcu::RGBA::toVec(&local_110);
    tcu::operator*(local_80,&local_90,&cScale);
    tcu::operator+((tcu *)&local_a8,(Vector<float,_4> *)local_80,&cBias);
    tcu::fillWithGrid((PixelBufferAccess *)
                      ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + local_f8 + -8),4
                      ,&gMin,(Vec4 *)&local_a8);
    local_f8 = local_f8 + 0x28;
  }
  glu::Texture3D::upload(this->m_gradientTex);
  glu::Texture3D::upload(this->m_gridTex);
  gMax.m_data[0] = 1.5;
  gMax.m_data[1] = 2.8;
  gMax.m_data[2] = 1.0;
  local_128.m_data[0] = -1.0;
  local_128.m_data[1] = -2.7;
  local_128.m_data[2] = -2.275;
  FilterCase::FilterCase((FilterCase *)&gMin,this->m_gradientTex,(Vec3 *)&gMax,(Vec3 *)&local_128);
  this_00 = &this->m_cases;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)&gMin);
  gMax.m_data[0] = -2.0;
  gMax.m_data[1] = -1.5;
  gMax.m_data[2] = -1.8;
  local_128.m_data[0] = -0.1;
  local_128.m_data[1] = 0.9;
  local_128.m_data[2] = -0.25;
  FilterCase::FilterCase((FilterCase *)&gMin,this->m_gradientTex,(Vec3 *)&gMax,(Vec3 *)&local_128);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)&gMin);
  gMax.m_data[0] = 0.2;
  gMax.m_data[1] = 0.175;
  gMax.m_data[2] = 0.3;
  local_128.m_data[0] = -2.0;
  local_128.m_data[1] = -3.7;
  local_128.m_data[2] = -1.825;
  FilterCase::FilterCase((FilterCase *)&gMin,this->m_gridTex,(Vec3 *)&gMax,(Vec3 *)&local_128);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)&gMin);
  gMax.m_data[0] = -0.8;
  gMax.m_data[1] = -2.3;
  gMax.m_data[2] = -2.5;
  local_128.m_data[0] = 0.2;
  local_128.m_data[1] = -0.1;
  local_128.m_data[2] = 1.325;
  FilterCase::FilterCase((FilterCase *)&gMin,this->m_gridTex,(Vec3 *)&gMax,(Vec3 *)&local_128);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)&gMin);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture3DFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);
		m_gridTex		= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			tcu::Vec4 gMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			tcu::Vec4 gMax = tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)*cScale + cBias;

			m_gradientTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_gridTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_gridTex->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(1.5f, 2.8f, 1.0f),	tcu::Vec3(-1.0f, -2.7f, -2.275f)));
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(-2.0f, -1.5f, -1.8f),	tcu::Vec3(-0.1f, 0.9f, -0.25f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(0.2f, 0.175f, 0.3f),	tcu::Vec3(-2.0f, -3.7f, -1.825f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(-0.8f, -2.3f, -2.5f),	tcu::Vec3(0.2f, -0.1f, 1.325f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture3DFilteringCase::deinit();
		throw;
	}
}